

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::write<char>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *this,basic_string_view<char> s,
          format_specs *specs)

{
  char *pcVar1;
  char *size;
  basic_string_view<char> s_00;
  
  size = (char *)s.size_;
  pcVar1 = (char *)(long)specs->precision;
  if ((-1 < (long)pcVar1) && (pcVar1 < size)) {
    s_00.size_ = (size_t)pcVar1;
    s_00.data_ = size;
    size = (char *)code_point_index((internal *)s.data_,s_00,(size_t)specs);
  }
  write<char>(this,s.data_,(size_t)size,specs);
  return;
}

Assistant:

void write(basic_string_view<Char> s, const format_specs& specs = {}) {
    const Char* data = s.data();
    std::size_t size = s.size();
    if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
      size = code_point_index(s, to_unsigned(specs.precision));
    write(data, size, specs);
  }